

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  ImVec2 local_44;
  undefined1 local_3c [8];
  ImRect rect;
  float thickness_local;
  float perp_padding_local;
  int border_n_local;
  ImGuiWindow *window_local;
  
  rect.Max.x = thickness;
  rect.Max.y = perp_padding;
  _local_3c = ImGuiWindow::Rect(window);
  if ((rect.Max.x == 0.0) && (!NAN(rect.Max.x))) {
    ImVec2::ImVec2(&local_44,1.0,1.0);
    operator-=(&rect.Min,&local_44);
  }
  if (border_n == 0) {
    ImRect::ImRect((ImRect *)&window_local,(float)local_3c._0_4_ + rect.Max.y,
                   (float)local_3c._4_4_ - rect.Max.x,rect.Min.x - rect.Max.y,
                   (float)local_3c._4_4_ + rect.Max.x);
  }
  else if (border_n == 1) {
    ImRect::ImRect((ImRect *)&window_local,rect.Min.x - rect.Max.x,
                   (float)local_3c._4_4_ + rect.Max.y,rect.Min.x + rect.Max.x,
                   rect.Min.y - rect.Max.y);
  }
  else if (border_n == 2) {
    ImRect::ImRect((ImRect *)&window_local,(float)local_3c._0_4_ + rect.Max.y,
                   rect.Min.y - rect.Max.x,rect.Min.x - rect.Max.y,rect.Min.y + rect.Max.x);
  }
  else {
    if (border_n != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x13a7,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
    }
    ImRect::ImRect((ImRect *)&window_local,(float)local_3c._0_4_ - rect.Max.x,
                   (float)local_3c._4_4_ + rect.Max.y,(float)local_3c._0_4_ + rect.Max.x,
                   rect.Min.y - rect.Max.y);
  }
  return _window_local;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);      // Top
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding);   // Right
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);      // Bottom
    if (border_n == 3) return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);   // Left
    IM_ASSERT(0);
    return ImRect();
}